

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adjointstepper.c
# Opt level: O1

SUNErrCode SUNAdjointStepper_Destroy(SUNAdjointStepper *self_ptr)

{
  SUNAdjointStepper __ptr;
  
  __ptr = *self_ptr;
  if (__ptr->own_fwd_sunstepper != 0) {
    SUNStepper_Destroy(&__ptr->fwd_sunstepper);
  }
  if (__ptr->own_adj_sunstepper != 0) {
    SUNStepper_Destroy(&__ptr->adj_sunstepper);
  }
  free(__ptr);
  *self_ptr = (SUNAdjointStepper)0x0;
  return 0;
}

Assistant:

SUNErrCode SUNAdjointStepper_Destroy(SUNAdjointStepper* self_ptr)
{
  SUNAdjointStepper self = *self_ptr;
  if (self->own_fwd_sunstepper) { SUNStepper_Destroy(&self->fwd_sunstepper); }
  if (self->own_adj_sunstepper) { SUNStepper_Destroy(&self->adj_sunstepper); }
  free(self);
  *self_ptr = NULL;
  return SUN_SUCCESS;
}